

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry
          (ParameterizedTestCaseRegistry *this)

{
  long lVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppPVar3 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar3 != ppPVar2) {
    do {
      if (*ppPVar3 != (ParameterizedTestCaseInfoBase *)0x0) {
        (**(code **)(*(long *)*ppPVar3 + 8))();
        ppPVar2 = (this->test_case_infos_).
                  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppPVar3 = ppPVar3 + 1;
    } while (ppPVar3 != ppPVar2);
    ppPVar3 = (this->test_case_infos_).
              super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppPVar3 == (pointer)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(ppPVar3,(long)(this->test_case_infos_).
                                  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar3
                   );
    return;
  }
  __stack_chk_fail();
}

Assistant:

~ParameterizedTestCaseRegistry() {
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      delete *it;
    }
  }